

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall el::base::debug::CrashHandler::setHandler(CrashHandler *this,Handler *cHandler)

{
  __sighandler_t p_Var1;
  int local_1c;
  int i;
  Handler *cHandler_local;
  CrashHandler *this_local;
  
  this->m_handler = *cHandler;
  for (local_1c = 1; local_1c < 5; local_1c = local_1c + 1) {
    p_Var1 = signal(*(int *)(consts::kCrashSignals + (long)local_1c * 0x20),
                    (__sighandler_t)*cHandler);
    this->m_handler = (Handler)p_Var1;
  }
  return;
}

Assistant:

void setHandler(const Handler& cHandler) {
        m_handler = cHandler;
#if defined(ELPP_HANDLE_SIGABRT)
            int i = 0;  // SIGABRT is at base::consts::kCrashSignals[0]
#else
            int i = 1;
#endif  // defined(ELPP_HANDLE_SIGABRT)
        for (; i < base::consts::kCrashSignalsCount; ++i) {
            m_handler = signal(base::consts::kCrashSignals[i].numb, cHandler);
        }
    }